

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O2

float __thiscall MILBlob::Fp8E5M2::GetFloat(Fp8E5M2 *this)

{
  byte bVar1;
  FloatCast local_14;
  
  bVar1 = (this->data).byte;
  local_14.bytes = (bVar1 & 0xffffff80) * 0x1000000;
  if ((~bVar1 & 0x7c) == 0) {
    local_14.bytes = (bVar1 & 3) + local_14.bytes + 0x7f800000;
  }
  else {
    HandleFp8ToFp32ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>(&this->data,&local_14);
    HandleFp8ToFp32Denormalize<MILBlob::Fp8E5M2::Cast_const>(&this->data,&local_14);
  }
  return local_14.f;
}

Assistant:

float Fp8E5M2::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;

    // Standard NaN/Inf case. We just use the fp8 mantissa as there's
    // no strong requirements for mantissa in the NaN case.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}